

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O2

void __thiscall
SphericalTriangleArea_RandomSampling_Test::TestBody(SphericalTriangleArea_RandomSampling_Test *this)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  int iVar5;
  uint64_t sequenceIndex;
  char *message;
  int iVar6;
  undefined1 auVar7 [16];
  float fVar8;
  Float FVar9;
  undefined1 auVar10 [16];
  undefined1 extraout_var [56];
  undefined1 auVar11 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar12 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  Vector3f VVar20;
  Vector3<float> VVar21;
  initializer_list<float> __l;
  Tuple3<pbrt::Vector3,_float> local_140;
  Tuple3<pbrt::Vector3,_float> local_130;
  Tuple3<pbrt::Vector3,_float> local_120;
  Tuple3<pbrt::Vector3,_float> local_110;
  aligned_storage_t<sizeof(pbrt::TriangleIntersection),_alignof(pbrt::TriangleIntersection)>
  local_100;
  byte local_f0;
  AssertionResult gtest_ar;
  Hammersley2DIter __begin2;
  Tuple3<pbrt::Vector3,_float> local_b8;
  Float error;
  float fStack_a4;
  float local_a0;
  Point2f u;
  Tuple3<pbrt::Vector3,_float> local_88;
  Tuple3<pbrt::Vector3,_float> local_78;
  RNG rng;
  Frame frame;
  undefined1 auVar19 [56];
  undefined1 extraout_var_02 [56];
  
  for (sequenceIndex = 0; sequenceIndex != 100; sequenceIndex = sequenceIndex + 1) {
    pbrt::RNG::SetSequence(&rng,sequenceIndex);
    fVar8 = pbrt::RNG::Uniform<float>(&rng);
    gtest_ar._4_4_ = pbrt::RNG::Uniform<float>(&rng);
    gtest_ar._0_4_ = fVar8;
    auVar19 = extraout_var;
    VVar20 = pbrt::SampleUniformSphere((Point2f *)&gtest_ar);
    local_130.z = VVar20.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar11._0_8_ = VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar11._8_56_ = auVar19;
    local_130._0_8_ = vmovlps_avx(auVar11._0_16_);
    fVar8 = pbrt::RNG::Uniform<float>(&rng);
    gtest_ar._4_4_ = pbrt::RNG::Uniform<float>(&rng);
    gtest_ar._0_4_ = fVar8;
    auVar19 = extraout_var_00;
    VVar20 = pbrt::SampleUniformSphere((Point2f *)&gtest_ar);
    local_140.z = VVar20.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar12._0_8_ = VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar12._8_56_ = auVar19;
    local_140._0_8_ = vmovlps_avx(auVar12._0_16_);
    fVar8 = pbrt::RNG::Uniform<float>(&rng);
    gtest_ar._4_4_ = pbrt::RNG::Uniform<float>(&rng);
    gtest_ar._0_4_ = fVar8;
    auVar19 = extraout_var_01;
    VVar20 = pbrt::SampleUniformSphere((Point2f *)&gtest_ar);
    local_110.z = VVar20.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar13._0_8_ = VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar13._8_56_ = auVar19;
    local_110._0_8_ = vmovlps_avx(auVar13._0_16_);
    auVar7._0_4_ = local_130.x + local_140.x + VVar20.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar7._4_4_ = local_130.y + local_140.y + VVar20.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar7._8_4_ = auVar19._0_4_ + 0.0;
    auVar7._12_4_ = auVar19._4_4_ + 0.0;
    auVar19 = ZEXT856(auVar7._8_8_);
    gtest_ar.message_.ptr_._0_4_ = local_110.z + local_130.z + local_140.z;
    gtest_ar._0_8_ = vmovlps_avx(auVar7);
    VVar21 = pbrt::Normalize<float>((Vector3<float> *)&gtest_ar);
    local_b8.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar14._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar14._8_56_ = auVar19;
    local_b8._0_8_ = vmovlps_avx(auVar14._0_16_);
    pbrt::Frame::FromZ(&frame,(Vector3f *)&local_b8);
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(local_b8.y * local_130.y)),ZEXT416((uint)local_b8.x),
                             ZEXT416((uint)local_130.x));
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(local_b8.y * local_140.y)),ZEXT416((uint)local_b8.x),
                             ZEXT416((uint)local_140.x));
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(local_b8.y * local_110.y)),ZEXT416((uint)local_b8.x),
                              ZEXT416((uint)local_110.x));
    auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)local_b8.z),ZEXT416((uint)local_130.z));
    auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)local_b8.z),ZEXT416((uint)local_140.z));
    auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)local_b8.z),ZEXT416((uint)local_110.z));
    gtest_ar._4_4_ = auVar3._0_4_;
    gtest_ar._0_4_ = auVar7._0_4_;
    gtest_ar.message_.ptr_._0_4_ = auVar10._0_4_;
    __l._M_len = 3;
    __l._M_array = (iterator)&gtest_ar;
    fVar8 = std::min<float>(__l);
    FVar9 = pbrt::SphericalTriangleArea
                      ((Vector3f *)&local_130,(Vector3f *)&local_140,(Vector3f *)&local_110);
    iVar6 = 0;
    __begin2.super_IndexingIterator<pbrt::detail::Hammersley2DIter>.i = 0;
    __begin2.super_IndexingIterator<pbrt::detail::Hammersley2DIter>.n = 40000;
    iVar5 = 0;
    while (iVar5 != 40000) {
      auVar15._0_8_ = pbrt::detail::Hammersley2DIter::operator*(&__begin2);
      auVar15._8_56_ = extraout_var_02;
      local_120.x = 0.0;
      local_120.y = 0.0;
      local_120.z = 0.0;
      u.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar15._0_16_)
      ;
      if (FVar9 <= 3.1415927) {
        auVar19 = (undefined1  [56])0x0;
        VVar20 = pbrt::SampleUniformCone(&u,fVar8);
        local_120.z = VVar20.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar17._0_8_ = VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar17._8_56_ = auVar19;
        local_120._0_8_ = vmovlps_avx(auVar17._0_16_);
        VVar20 = pbrt::Frame::FromLocal(&frame,(Vector3f *)&local_120);
        local_120.z = VVar20.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar18._0_8_ = VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar18._8_56_ = auVar19;
        auVar7 = auVar18._0_16_;
      }
      else {
        auVar19 = extraout_var_02;
        VVar20 = pbrt::SampleUniformSphere(&u);
        local_120.z = VVar20.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar16._0_8_ = VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar16._8_56_ = auVar19;
        auVar7 = auVar16._0_16_;
      }
      local_120._0_8_ = vmovlps_avx(auVar7);
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
      gtest_ar.message_.ptr_._0_4_ = 0.0;
      error = local_130.x;
      fStack_a4 = local_130.y;
      local_a0 = local_130.z;
      local_78.x = local_140.x;
      local_78.y = local_140.y;
      gtest_ar.message_.ptr_._4_4_ = local_120.x;
      local_78.z = local_140.z;
      local_88.x = local_110.x;
      local_88.y = local_110.y;
      local_88.z = local_110.z;
      pbrt::IntersectTriangle
                ((optional<pbrt::TriangleIntersection> *)&local_100.__align,(Ray *)&gtest_ar,
                 INFINITY,(Point3f *)&error,(Point3f *)&local_78,(Point3f *)&local_88);
      bVar4 = local_f0;
      pstd::optional<pbrt::TriangleIntersection>::~optional
                ((optional<pbrt::TriangleIntersection> *)&local_100.__align);
      iVar6 = iVar6 + (uint)bVar4;
      iVar5 = __begin2.super_IndexingIterator<pbrt::detail::Hammersley2DIter>.i + 1;
      __begin2.super_IndexingIterator<pbrt::detail::Hammersley2DIter>.i = iVar5;
    }
    local_100.__align = (anon_struct_4_0_00000001_for___align)0x3d0f5c29;
    uVar1 = vcmpss_avx512f(ZEXT416((uint)FVar9),ZEXT416(0x40490fdb),0xe);
    bVar2 = (bool)((byte)uVar1 & 1);
    fVar8 = (float)iVar6 /
            (float)((uint)bVar2 * 0x4546f194 +
                   (uint)!bVar2 * (int)((1.0 / ((1.0 - fVar8) * 6.2831855)) * 40000.0));
    auVar10._0_4_ = (fVar8 - FVar9) / FVar9;
    auVar10._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar3._8_4_ = 0x7fffffff;
    auVar3._0_8_ = 0x7fffffff7fffffff;
    auVar3._12_4_ = 0x7fffffff;
    auVar7 = vandps_avx512vl(auVar10,auVar3);
    error = auVar7._0_4_;
    testing::internal::CmpHelperLT<float,float>
              ((internal *)&gtest_ar,"error","0.035f",&error,(float *)&local_100.__align);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_100.__align);
      std::operator<<((ostream *)(CONCAT44(local_100._4_4_,local_100.__align) + 0x10),"Area ");
      std::ostream::operator<<((void *)(CONCAT44(local_100._4_4_,local_100.__align) + 0x10),FVar9);
      std::operator<<((ostream *)(CONCAT44(local_100._4_4_,local_100.__align) + 0x10),", estimate ")
      ;
      std::ostream::operator<<((void *)(CONCAT44(local_100._4_4_,local_100.__align) + 0x10),fVar8);
      std::operator<<((ostream *)(CONCAT44(local_100._4_4_,local_100.__align) + 0x10),", va = ");
      pbrt::operator<<((ostream *)(CONCAT44(local_100._4_4_,local_100.__align) + 0x10),
                       (Vector3<float> *)&local_130);
      std::operator<<((ostream *)(CONCAT44(local_100._4_4_,local_100.__align) + 0x10),", vb = ");
      pbrt::operator<<((ostream *)(CONCAT44(local_100._4_4_,local_100.__align) + 0x10),
                       (Vector3<float> *)&local_140);
      std::operator<<((ostream *)(CONCAT44(local_100._4_4_,local_100.__align) + 0x10),", vc = ");
      pbrt::operator<<((ostream *)(CONCAT44(local_100._4_4_,local_100.__align) + 0x10),
                       (Vector3<float> *)&local_110);
      message = "";
      if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) !=
          (undefined8 *)0x0) {
        message = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
                 ,0x227,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_120,(Message *)&local_100.__align);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_100.__align);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  return;
}

Assistant:

TEST(SphericalTriangleArea, RandomSampling) {
    for (int i = 0; i < 100; ++i) {
        RNG rng(i);
        Vector3f a = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
        Vector3f b = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
        Vector3f c = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});

        Vector3f axis = Normalize(a + b + c);
        Frame frame = Frame::FromZ(axis);
        Float cosTheta = std::min({Dot(a, axis), Dot(b, axis), Dot(c, axis)});

        Float area = SphericalTriangleArea(a, b, c);
        bool sampleSphere = area > Pi;
        int sqrtN = 200;
        int count = 0;
        for (Point2f u : Hammersley2D(sqrtN * sqrtN)) {
            Vector3f v;
            if (sampleSphere)
                v = SampleUniformSphere(u);
            else {
                v = SampleUniformCone(u, cosTheta);
                v = frame.FromLocal(v);
            }

            if (IntersectTriangle(Ray(Point3f(0, 0, 0), v), Infinity, Point3f(a),
                                  Point3f(b), Point3f(c)))
                ++count;
        }

        Float pdf = sampleSphere ? UniformSpherePDF() : UniformConePDF(cosTheta);
        Float estA = Float(count) / (sqrtN * sqrtN * pdf);

        Float error = std::abs((estA - area) / area);
        EXPECT_LT(error, 0.035f) << "Area " << area << ", estimate " << estA
                                 << ", va = " << a << ", vb = " << b << ", vc = " << c;
    }
}